

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2c-test.cpp
# Opt level: O2

void __thiscall CommandOptions::CommandOptions(CommandOptions *this,int argc,char **argv)

{
  char cVar1;
  char *__s;
  int iVar2;
  long lVar3;
  allocator<char> local_61;
  CommandOptions *local_60;
  _List_node_base *local_58;
  value_type local_50;
  
  this->error_flag = true;
  local_58 = (_List_node_base *)&this->filename_list;
  this->version_flag = false;
  this->verbose_flag = false;
  this->detail_flag = false;
  this->help_flag = false;
  (this->filename_list).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = local_58;
  (this->filename_list).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = local_58;
  (this->filename_list).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  lVar3 = 1;
  local_60 = this;
  do {
    if (argc <= lVar3) {
      if ((((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_58->_M_next)->_M_impl)._M_node.super__List_node_base._M_next == local_58) {
        fputs("Input j2c filename(s) required.\n",_stderr);
      }
      else {
        local_60->error_flag = false;
      }
      return;
    }
    __s = argv[lVar3];
    if (*__s == '-') {
      cVar1 = __s[1];
      iVar2 = isalpha((int)cVar1);
      if ((iVar2 == 0) || (__s[2] != '\0')) goto LAB_00104df4;
      if (cVar1 == 'v') {
        local_60->verbose_flag = true;
      }
      else if (cVar1 == 'h') {
        local_60->help_flag = true;
      }
      else if (cVar1 == 'r') {
        local_60->detail_flag = true;
      }
      else {
        if (cVar1 != 'V') {
          fprintf(_stderr,"Unrecognized option: %c\n",(ulong)(uint)(int)cVar1);
          return;
        }
        local_60->version_flag = true;
      }
    }
    else {
LAB_00104df4:
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_61);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_58,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

CommandOptions(int argc, const char** argv) :
    error_flag(true), version_flag(false), verbose_flag(false),
    detail_flag(false), help_flag(false)
  {
    for ( int i = 1; i < argc; i++ )
      {
	if ( argv[i][0] == '-' && isalpha(argv[i][1]) && argv[i][2] == 0 )
	  {
	    switch ( argv[i][1] )
	      {
	      case 'V': version_flag = true; break;
	      case 'h': help_flag = true; break;
	      case 'r': detail_flag = true; break;
	      case 'v': verbose_flag = true; break;

	      default:
		fprintf(stderr, "Unrecognized option: %c\n", argv[i][1]);
		return;
	      }
	  }
	else
	  {
	    filename_list.push_back(argv[i]);
	  }
      }

    if ( filename_list.empty() )
      {
	fputs("Input j2c filename(s) required.\n", stderr);
	return;
      }

    error_flag = false;
  }